

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TestSpecParser::addNamePattern(TestSpecParser *this)

{
  ulong uVar1;
  vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  *in_RDI;
  string token;
  TestSpecParser *in_stack_00000088;
  unique_ptr<Catch::TestSpec::NamePattern> *in_stack_ffffffffffffffa0;
  pointer *ppuVar2;
  unique_ptr<Catch::TestSpec::NamePattern> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  string local_28 [40];
  
  preprocessPattern_abi_cxx11_(in_stack_00000088);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    if (((ulong)(in_RDI->
                super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
                )._M_impl.super__Vector_impl_data._M_finish & 1) == 0) {
      ppuVar2 = &in_RDI[6].
                 super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      Detail::make_unique<Catch::TestSpec::NamePattern,std::__cxx11::string&,std::__cxx11::string&>
                (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      std::
      vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
      ::emplace_back<Catch::Detail::unique_ptr<Catch::TestSpec::NamePattern>>
                (in_RDI,in_stack_ffffffffffffffa8);
      Detail::unique_ptr<Catch::TestSpec::NamePattern>::~unique_ptr
                ((unique_ptr<Catch::TestSpec::NamePattern> *)ppuVar2);
    }
    else {
      ppuVar2 = &in_RDI[7].
                 super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      Detail::make_unique<Catch::TestSpec::NamePattern,std::__cxx11::string&,std::__cxx11::string&>
                (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      std::
      vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
      ::emplace_back<Catch::Detail::unique_ptr<Catch::TestSpec::NamePattern>>
                (in_RDI,(unique_ptr<Catch::TestSpec::NamePattern> *)ppuVar2);
      Detail::unique_ptr<Catch::TestSpec::NamePattern>::~unique_ptr(in_stack_ffffffffffffffa0);
    }
  }
  std::__cxx11::string::clear();
  *(undefined1 *)
   &(in_RDI->
    super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = 0;
  *(undefined4 *)
   &(in_RDI->
    super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
    )._M_impl.super__Vector_impl_data._M_start = 0;
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void TestSpecParser::addNamePattern() {
        auto token = preprocessPattern();

        if (!token.empty()) {
            if (m_exclusion) {
                m_currentFilter.m_forbidden.emplace_back(Detail::make_unique<TestSpec::NamePattern>(token, m_substring));
            } else {
                m_currentFilter.m_required.emplace_back(Detail::make_unique<TestSpec::NamePattern>(token, m_substring));
            }
        }
        m_substring.clear();
        m_exclusion = false;
        m_mode = None;
    }